

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Data::Reset(Data *this)

{
  DataChunk *local_18;
  DataChunk *currentChunk;
  Data *this_local;
  
  this->currentOffset = 0;
  for (local_18 = this->head; local_18 != (DataChunk *)0x0; local_18 = local_18->nextChunk) {
    DataChunk::Reset(local_18);
  }
  this->current = this->head;
  return;
}

Assistant:

void ByteCodeWriter::Data::Reset()
    {
        currentOffset = 0;
        DataChunk* currentChunk = head;
        while (currentChunk)
        {
            // reset to the starting point
            currentChunk->Reset();
            currentChunk = currentChunk->nextChunk;
        }

        current = head;
    }